

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O2

void * tp_worker(void *args)

{
  pthread_mutex_t *__mutex;
  int *piVar1;
  cleanup_t p_Var2;
  qdata_t task;
  int iVar3;
  uint32_t uVar4;
  void *extraout_RAX;
  void *pvVar5;
  thread_pool_t *tp;
  char *__mutex_00;
  long lVar6;
  undefined1 local_148 [8];
  __pthread_unwind_buf_t __cancel_buf;
  undefined1 local_d8 [8];
  __pthread_unwind_buf_t __cancel_buf_1;
  cleanup_t local_50;
  void *local_48;
  qdata_t local_40;
  qdata_t data;
  
  iVar3 = __sigsetjmp(local_148);
  tp = (thread_pool_t *)local_148;
  if (iVar3 != 0) {
    __pthread_unwind_next((__pthread_unwind_buf_t *)tp);
    if (tp != (thread_pool_t *)0x0) {
      if (tp->threads != (pthread_t *)0x0) {
        for (lVar6 = 0; lVar6 < (int)tp->nthread; lVar6 = lVar6 + 1) {
          iVar3 = pthread_cancel(tp->threads[lVar6]);
          if (iVar3 != 0) {
            perror("pthread_cancel() failed");
          }
        }
        tp_join(tp);
        free(tp->threads);
      }
      iVar3 = pthread_cond_destroy((pthread_cond_t *)&tp->has_task);
      if (iVar3 != 0) {
        perror("pthread_cond_destroy() failed");
      }
      __mutex_00 = (char *)&tp->lock;
      iVar3 = pthread_mutex_destroy((pthread_mutex_t *)__mutex_00);
      if (iVar3 != 0) {
        __mutex_00 = "pthread_mutex_destroy()";
        perror("pthread_mutex_destroy()");
      }
      if (g_self_key_inited == '\x01') {
        _tp_self_destroy((thread_pool_t *)__mutex_00);
        g_self_key_inited = '\0';
      }
      queue_clear(&tp->task_queue);
      pvVar5 = memset(tp,0,0xb8);
      return pvVar5;
    }
    return extraout_RAX;
  }
  __pthread_register_cancel((__pthread_unwind_buf_t *)tp);
  __mutex = (pthread_mutex_t *)((long)args + 0x28);
  piVar1 = (int *)((long)args + 0x80);
  do {
    do {
      local_40.i64 = 0;
      pthread_mutex_lock(__mutex);
      iVar3 = __sigsetjmp((__pthread_unwind_buf_t *)local_d8,0);
      if (iVar3 != 0) {
        tp_cleanup_unlock(args);
        goto LAB_00102878;
      }
      __pthread_register_cancel((__pthread_unwind_buf_t *)local_d8);
      while( true ) {
        uVar4 = queue_len((queue_t *)((long)args + 0x10));
        if (uVar4 != 0) break;
        pthread_cond_wait((pthread_cond_t *)((long)args + 0x50),__mutex);
      }
      data.i64._7_1_ = queue_dequeue((queue_t *)((long)args + 0x10),&local_40);
      task = local_40;
      __pthread_unregister_cancel((__pthread_unwind_buf_t *)local_d8);
      pthread_mutex_unlock(__mutex);
    } while ((((tp_task_t *)task.i64 != (tp_task_t *)0x0 & data.u64._7_1_) != 1) ||
            (*task.ptr == (code *)0x0));
    p_Var2 = *(cleanup_t *)(task.i64 + 8);
    if (p_Var2 == (cleanup_t)0x0) {
      (**task.ptr)(*(void **)(task.i64 + 0x10));
    }
    else {
      local_48 = *(void **)(task.i64 + 0x10);
      iVar3 = __sigsetjmp((__pthread_unwind_buf_t *)local_d8,0);
      local_50 = p_Var2;
      if (iVar3 != 0) {
        do {
          (*local_50)(local_48);
LAB_00102878:
          __pthread_unwind_next((__pthread_unwind_buf_t *)local_d8);
        } while( true );
      }
      __pthread_register_cancel((__pthread_unwind_buf_t *)local_d8);
      (**task.ptr)(*(void **)(task.i64 + 0x10));
      __pthread_unregister_cancel((__pthread_unwind_buf_t *)local_d8);
      (**(cleanup_t *)(task.i64 + 8))(*(void **)(task.i64 + 0x10));
    }
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      pthread_cond_signal((pthread_cond_t *)((long)args + 0x88));
    }
    tp_task_free((tp_task_t *)task.ptr);
  } while( true );
}

Assistant:

void *tp_worker(void *args)
{
    qdata_t data;
    thread_pool_t *pool = args;
    tp_task_t *task = NULL;

    pthread_cleanup_push(tp_cleanup, pool) ;

            while (1) {
                data.ptr = NULL;
                task = NULL;

                // Take a task
                pthread_mutex_lock(&pool->lock);

                pthread_cleanup_push(tp_cleanup_unlock, pool) ;
                        // If no task in queue, wait until someone post one.
                        while (queue_isempty(&pool->task_queue)) {
                            pthread_cond_wait(&pool->has_task, &pool->lock);
                        }
                        // Dequeue a task for running
                        if (queue_dequeue(&pool->task_queue, &data)) {
                            task = data.ptr;
                        }

                pthread_cleanup_pop(0);

                pthread_mutex_unlock(&pool->lock);

                // Run a task
                if (task && task->runner) {
                    if (task->cleanup) {
                        pthread_cleanup_push(task->cleanup, task->args) ;
                                task->runner(task->args);
                        pthread_cleanup_pop(0);
                        task->cleanup(task->args);
                    } else {
                        task->runner(task->args);
                    }


                    // Note: pool->task_queue is empty DO NOT means there is no task
                    //
                    // If there is no task remain in the queue after dequeue operation,
                    // signal for tp_join_task()
                    if (__sync_sub_and_fetch(&pool->active_tasks, 1) == 0) {
                        pthread_cond_signal(&pool->no_task);
                    }

                    tp_task_free(task);
                    task = NULL;
                }
            }

    pthread_cleanup_pop(0);

    return NULL;
}